

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void __thiscall
Parser::MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
          (Parser *this,ParseNodePtr elementNode,anon_class_16_2_85211fcd handler)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  ulong uVar5;
  ParseNodeVar *pPVar6;
  undefined4 *puVar7;
  anon_class_16_2_85211fcd handler_00;
  
  handler_00.this = handler.this;
  bVar1 = *(byte *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  uVar5 = (ulong)bVar1;
  if (bVar1 == 0x11) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni((ParseNode *)this);
  }
  else {
    if (bVar1 != 0x31) goto LAB_00818434;
    pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)this);
  }
  this = (Parser *)pPVar4->pnode1;
  uVar5 = CONCAT71((int7)((ulong)pPVar4 >> 8),
                   *(OpCode *)
                    &(this->m_nodeAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_Allocator.outOfMemoryFunc);
LAB_00818434:
  handler_00.funcInfo = (FuncInfo **)(uVar5 & 0xfffffffd);
  if ((char)handler_00.funcInfo == 'p') {
    MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
              (this,elementNode,handler_00);
    return;
  }
  if ((byte)((char)uVar5 + 0xafU) < 3) {
    pPVar6 = ParseNode::AsParseNodeVar((ParseNode *)this);
    Symbol::EnsureScopeSlot
              (pPVar6->sym,(ByteCodeGenerator *)elementNode,
               (FuncInfo *)(handler_00.this)->scriptContext);
    return;
  }
  if ((char)uVar5 != '\v') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }